

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

bool __thiscall sentencepiece::ModelProto::IsInitialized(ModelProto *this)

{
  bool bVar1;
  
  bVar1 = google::protobuf::internal::ExtensionSet::IsInitialized(&this->_extensions_);
  if ((((((bVar1) &&
         (bVar1 = google::protobuf::internal::
                  AllAreInitialized<sentencepiece::ModelProto_SentencePiece>(&this->pieces_), bVar1)
         ) && ((bVar1 = _internal_has_trainer_spec(this), !bVar1 ||
               (bVar1 = google::protobuf::internal::ExtensionSet::IsInitialized
                                  (&this->trainer_spec_->_extensions_), bVar1)))) &&
       ((bVar1 = _internal_has_normalizer_spec(this), !bVar1 ||
        (bVar1 = google::protobuf::internal::ExtensionSet::IsInitialized
                           (&this->normalizer_spec_->_extensions_), bVar1)))) &&
      ((bVar1 = _internal_has_self_test_data(this), !bVar1 ||
       (bVar1 = google::protobuf::internal::ExtensionSet::IsInitialized
                          (&this->self_test_data_->_extensions_), bVar1)))) &&
     ((bVar1 = _internal_has_denormalizer_spec(this), !bVar1 ||
      (bVar1 = google::protobuf::internal::ExtensionSet::IsInitialized
                         (&this->denormalizer_spec_->_extensions_), bVar1)))) {
    return true;
  }
  return false;
}

Assistant:

bool ModelProto::IsInitialized() const {
  if (!_extensions_.IsInitialized()) {
    return false;
  }

  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(pieces_)) return false;
  if (_internal_has_trainer_spec()) {
    if (!trainer_spec_->IsInitialized()) return false;
  }
  if (_internal_has_normalizer_spec()) {
    if (!normalizer_spec_->IsInitialized()) return false;
  }
  if (_internal_has_self_test_data()) {
    if (!self_test_data_->IsInitialized()) return false;
  }
  if (_internal_has_denormalizer_spec()) {
    if (!denormalizer_spec_->IsInitialized()) return false;
  }
  return true;
}